

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger array_sort(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  SQOuter *arr;
  SQObjectValue SVar2;
  bool bVar3;
  SQObjectPtr *pSVar4;
  SQInteger SVar5;
  long lVar6;
  SQArray *a;
  SQUnsignedInteger SVar7;
  long func;
  
  pSVar4 = stack_get(v,1);
  if (((pSVar4->super_SQObject)._unVal.pOuter)->_idx < 2) {
    return 0;
  }
  SVar5 = sq_gettop(v);
  func = (ulong)(SVar5 == 2) * 3 + -1;
  arr = (pSVar4->super_SQObject)._unVal.pOuter;
  SVar7 = arr->_idx;
  lVar6 = (long)SVar7 / 2;
  do {
    if (lVar6 < 0) {
      lVar6 = SVar7 * 0x10 + -8;
      do {
        if ((long)SVar7 < 2) {
          return 0;
        }
        pSVar4 = ((SQObjectPtrVec *)&arr->_valptr)->_vals;
        SVar1 = (pSVar4->super_SQObject)._type;
        SVar2 = (pSVar4->super_SQObject)._unVal;
        (pSVar4->super_SQObject)._type = *(SQObjectType *)((long)pSVar4 + lVar6 + -8);
        (pSVar4->super_SQObject)._unVal =
             *(SQObjectValue *)((long)&(pSVar4->super_SQObject)._type + lVar6);
        *(SQObjectType *)((long)pSVar4 + lVar6 + -8) = SVar1;
        *(SQObjectValue *)((long)&(pSVar4->super_SQObject)._type + lVar6) = SVar2;
        bVar3 = _hsort_sift_down(v,(SQArray *)arr,0,SVar7 - 2,func);
        lVar6 = lVar6 + -0x10;
        SVar7 = SVar7 - 1;
      } while (bVar3);
      return -1;
    }
    bVar3 = _hsort_sift_down(v,(SQArray *)arr,lVar6,SVar7 - 1,func);
    lVar6 = lVar6 + -1;
  } while (bVar3);
  return -1;
}

Assistant:

static SQInteger array_sort(HSQUIRRELVM v)
{
    SQInteger func = -1;
    SQObjectPtr &o = stack_get(v,1);
    if(_array(o)->Size() > 1) {
        if(sq_gettop(v) == 2) func = 2;
        if(!_hsort(v, o, 0, _array(o)->Size()-1, func))
            return SQ_ERROR;

    }
    return 0;
}